

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O0

void __thiscall
CGL::GLScene::Sphere::Sphere(Sphere *this,SphereInfo *info,Vector3D *position,double scale)

{
  void *pvVar1;
  DiffuseBSDF *in_RDX;
  long in_RSI;
  Vector3D *in_RDI;
  double in_XMM0_Qa;
  Vector3D local_48;
  double local_20;
  long local_10;
  
  local_20 = in_XMM0_Qa;
  local_10 = in_RSI;
  SceneObject::SceneObject((SceneObject *)in_RDI);
  (in_RDI->field_0).field_0.x = (double)&PTR_set_draw_styles_00398218;
  *(double *)((long)&in_RDI->field_0 + 8) = (double)*(float *)(local_10 + 0x48) * local_20;
  Vector3D::Vector3D((Vector3D *)((long)&in_RDI->field_0 + 0x10),(Vector3D *)in_RDX);
  if (*(long *)(local_10 + 0x50) == 0) {
    pvVar1 = operator_new(0x50);
    Vector3D::Vector3D(&local_48,0.5,0.5,0.5);
    DiffuseBSDF::DiffuseBSDF(in_RDX,in_RDI);
    in_RDI[1].field_0.field_0.z = (double)pvVar1;
  }
  else {
    *(undefined8 *)((long)&in_RDI[1].field_0 + 0x10) =
         *(undefined8 *)(*(long *)(local_10 + 0x50) + 0x48);
  }
  return;
}

Assistant:

Sphere::Sphere(const Collada::SphereInfo& info, 
               const Vector3D position, const double scale) : 
  p(position), r(info.radius * scale) { 
  if (info.material) {
    bsdf = info.material->bsdf;
  } else {
    bsdf = new DiffuseBSDF(Vector3D(0.5f,0.5f,0.5f));    
  }
}